

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_impl.cpp
# Opt level: O0

void __thiscall
icu_63::numparse::impl::NumberParserImpl::NumberParserImpl
          (NumberParserImpl *this,parse_flags_t parseFlags)

{
  parse_flags_t parseFlags_local;
  NumberParserImpl *this_local;
  
  MutableMatcherCollection::MutableMatcherCollection(&this->super_MutableMatcherCollection);
  (this->super_MutableMatcherCollection)._vptr_MutableMatcherCollection =
       (_func_int **)&PTR__NumberParserImpl_004f3b58;
  this->fParseFlags = parseFlags;
  this->fNumMatchers = 0;
  MaybeStackArray<const_icu_63::numparse::impl::NumberParseMatcher_*,_10>::MaybeStackArray
            (&this->fMatchers);
  this->fFrozen = false;
  {unnamed_type#1}::NumberParserImpl((_unnamed_type_1_ *)&this->fLocalMatchers);
  {unnamed_type#2}::NumberParserImpl((_unnamed_type_2_ *)&this->fLocalValidators);
  return;
}

Assistant:

NumberParserImpl::NumberParserImpl(parse_flags_t parseFlags)
        : fParseFlags(parseFlags) {
}